

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O2

int mov_c_bitaddr(em8051 *aCPU)

{
  byte bVar1;
  uint uVar2;
  uchar *puVar3;
  
  puVar3 = aCPU->mSFR;
  bVar1 = aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U];
  if ((char)bVar1 < '\0') {
    if (aCPU->sfrread == (em8051sfrread)0x0) {
      uVar2 = (uint)puVar3[(ulong)(bVar1 & 0xfffffff8) - 0x80];
    }
    else {
      uVar2 = (*aCPU->sfrread)(aCPU,bVar1 & 0xfffffff8);
      puVar3 = aCPU->mSFR;
    }
    bVar1 = (byte)(uVar2 >> (bVar1 & 7));
  }
  else {
    bVar1 = aCPU->mLowerData[(ulong)(bVar1 >> 3) + 0x20] >> (bVar1 & 7);
  }
  puVar3[0x50] = bVar1 << 7 | puVar3[0x50] & 0x7f;
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int mov_c_bitaddr(struct em8051 *aCPU) 
{
    int address = OPERAND1;
    int carry = CARRY;
    if (address > 0x7f)
    {
        int bit = address & 7;
        int bitmask = (1 << bit);
        int value;
        address &= 0xf8;        
        if (aCPU->sfrread)
            value = aCPU->sfrread(aCPU, address);
        else
            value = aCPU->mSFR[address - 0x80];

        value = (value & bitmask) ? 1 : 0;

        PSW = (PSW & ~PSWMASK_C) | (PSWMASK_C * value);
    }
    else
    {
        int bit = address & 7;
        int bitmask = (1 << bit);
        int value;
        address >>= 3;
        address += 0x20;
        value = (aCPU->mLowerData[address] & bitmask) ? 1 : 0;
        PSW = (PSW & ~PSWMASK_C) | (PSWMASK_C * value);
    }

    PC += 2;
    return 0;
}